

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaL_typerror(lua_State *L,int narg,char *tname)

{
  int iVar1;
  char *pcVar2;
  char *msg;
  char *tname_local;
  int narg_local;
  lua_State *L_local;
  
  iVar1 = lua_type(L,narg);
  pcVar2 = lua_typename(L,iVar1);
  pcVar2 = lua_pushfstring(L,"%s expected, got %s",tname,pcVar2);
  iVar1 = luaL_argerror(L,narg,pcVar2);
  return iVar1;
}

Assistant:

static int luaL_typerror(lua_State*L,int narg,const char*tname){
const char*msg=lua_pushfstring(L,"%s expected, got %s",
tname,luaL_typename(L,narg));
return luaL_argerror(L,narg,msg);
}